

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddDependenciesCommand.cxx
# Opt level: O1

bool cmAddDependenciesCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *psVar1;
  cmMakefile *this;
  string *psVar2;
  bool bVar3;
  cmTarget *this_00;
  ulong uVar4;
  string *arg;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string local_78;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  size_type local_48;
  pointer local_40;
  undefined8 local_38;
  char *local_30;
  
  psVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)psVar1;
  if (uVar4 < 0x21) {
    local_58._M_len = (size_t)&local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_78.field_2._M_allocated_capacity = local_48;
    local_78._M_dataplus._M_p = (pointer)local_58._M_len;
    if ((size_type *)local_58._M_len == &local_48) goto LAB_0022c15b;
  }
  else {
    this = status->Makefile;
    bVar3 = cmMakefile::IsAlias(this,psVar1);
    if (bVar3) {
      local_40 = (psVar1->_M_dataplus)._M_p;
      local_48 = psVar1->_M_string_length;
      local_58._M_len = 0x36;
      local_58._M_str = "Cannot add target-level dependencies to alias target \"";
      local_38 = 3;
      local_30 = "\".\n";
      views._M_len = 3;
      views._M_array = &local_58;
      cmCatViews_abi_cxx11_(&local_78,views);
      cmMakefile::IssueMessage(this,FATAL_ERROR,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
    this_00 = cmMakefile::FindTargetToUse(this,psVar1,false);
    if (this_00 != (cmTarget *)0x0) {
      psVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      psVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      while (psVar1 = psVar1 + 1, psVar1 != psVar2) {
        cmTarget::AddUtility(this_00,psVar1,false,this);
      }
      goto LAB_0022c15b;
    }
    local_40 = (psVar1->_M_dataplus)._M_p;
    local_48 = psVar1->_M_string_length;
    local_58._M_len = 0x3d;
    local_58._M_str = "Cannot add target-level dependencies to non-existent target \"";
    local_38 = 0x103;
    local_30 = 
    "\".\nThe add_dependencies works for top-level logical targets created by the add_executable, add_library, or add_custom_target commands.  If you want to add file-level dependencies see the DEPENDS option of the add_custom_target and add_custom_command commands."
    ;
    views_00._M_len = 3;
    views_00._M_array = &local_58;
    cmCatViews_abi_cxx11_(&local_78,views_00);
    cmMakefile::IssueMessage(this,FATAL_ERROR,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_0022c15b;
  }
  operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
LAB_0022c15b:
  return 0x20 < uVar4;
}

Assistant:

bool cmAddDependenciesCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  std::string const& target_name = args[0];
  if (mf.IsAlias(target_name)) {
    mf.IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Cannot add target-level dependencies to alias target \"",
               target_name, "\".\n"));
  }
  if (cmTarget* target = mf.FindTargetToUse(target_name)) {

    // skip over target_name
    for (std::string const& arg : cmMakeRange(args).advance(1)) {
      target->AddUtility(arg, false, &mf);
    }
  } else {
    mf.IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(
        "Cannot add target-level dependencies to non-existent "
        "target \"",
        target_name,
        "\".\nThe add_dependencies works for "
        "top-level logical targets created by the add_executable, "
        "add_library, or add_custom_target commands.  If you want to add "
        "file-level dependencies see the DEPENDS option of the "
        "add_custom_target and add_custom_command commands."));
  }

  return true;
}